

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

void __thiscall
mkvparser::Block::Block(Block *this,longlong start,longlong size_,longlong discard_padding)

{
  this->m_start = start;
  this->m_size = size_;
  this->m_track = 0;
  this->m_timecode = -1;
  this->m_flags = '\0';
  this->m_frames = (Frame *)0x0;
  this->m_frame_count = -1;
  this->m_discard_padding = discard_padding;
  return;
}

Assistant:

Block::Block(long long start, long long size_, long long discard_padding)
    : m_start(start),
      m_size(size_),
      m_track(0),
      m_timecode(-1),
      m_flags(0),
      m_frames(NULL),
      m_frame_count(-1),
      m_discard_padding(discard_padding) {}